

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O0

int __thiscall so_5::stats::impl::std_controller_t::remove(std_controller_t *this,char *__filename)

{
  int extraout_EAX;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  source_t *what_local;
  std_controller_t *this_local;
  
  lock._M_device = (mutex_type *)__filename;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_data_lock);
  repository_t::source_list_remove((source_t *)lock._M_device,&this->m_head,&this->m_tail);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void
std_controller_t::remove( source_t & what )
	{
		std::lock_guard< std::mutex > lock{ m_data_lock };

		source_list_remove( what, m_head, m_tail );
	}